

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v10::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v10 *this,string_view fmt,format_args args)

{
  basic_string_view<char> fmt_00;
  type args_00;
  memory_buffer buffer;
  buffer<char> local_228;
  char local_208 [504];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )args.desc_;
  args_00.desc_ = fmt.size_;
  fmt_00.size_ = fmt.data_;
  local_228.size_ = 0;
  local_228._vptr_buffer = (_func_int **)&PTR_grow_001da800;
  local_228.capacity_ = 500;
  fmt_00.data_ = (char *)this;
  local_228.ptr_ = local_208;
  detail::vformat_to<char>(&local_228,fmt_00,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228.ptr_,local_228.ptr_ + local_228.size_);
  if (local_228.ptr_ != local_208) {
    operator_delete(local_228.ptr_,local_228.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto vformat(string_view fmt, format_args args) -> std::string {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}